

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_GradientColorData *
ON_GradientColorData::FromObject(ON_Object *obj,bool createAndAttachIfMissing)

{
  bool bVar1;
  ON_UserData *p;
  ON_GradientColorData *this;
  ON_UUID local_38;
  ON_GradientColorData *local_28;
  ON_GradientColorData *rc;
  ON_Object *pOStack_18;
  bool createAndAttachIfMissing_local;
  ON_Object *obj_local;
  
  if (obj == (ON_Object *)0x0) {
    obj_local = (ON_Object *)0x0;
  }
  else {
    rc._7_1_ = createAndAttachIfMissing;
    pOStack_18 = obj;
    local_38 = ON_ClassId::Uuid(&m_ON_GradientColorData_class_rtti);
    p = ON_Object::GetUserData(obj,&local_38);
    local_28 = Cast(&p->super_ON_Object);
    if ((local_28 == (ON_GradientColorData *)0x0) && ((rc._7_1_ & 1) != 0)) {
      this = (ON_GradientColorData *)operator_new(0x120);
      ON_GradientColorData(this);
      local_28 = this;
      bVar1 = ON_Object::AttachUserData(pOStack_18,(ON_UserData *)this);
      if (!bVar1) {
        if (local_28 != (ON_GradientColorData *)0x0) {
          (*(local_28->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])();
        }
        return (ON_GradientColorData *)0x0;
      }
    }
    obj_local = (ON_Object *)local_28;
  }
  return (ON_GradientColorData *)obj_local;
}

Assistant:

ON_GradientColorData* ON_GradientColorData::FromObject(ON_Object* obj, bool createAndAttachIfMissing)
{
  if (nullptr == obj)
    return nullptr;
  ON_GradientColorData* rc = ON_GradientColorData::Cast(obj->GetUserData(ON_CLASS_ID(ON_GradientColorData)));
  if (nullptr == rc && createAndAttachIfMissing)
  {
    rc = new ON_GradientColorData();
    if (!obj->AttachUserData(rc))
    {
      delete rc;
      return nullptr;
    }
  }
  return rc;
}